

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O1

Offset<reflection::RPCCall> __thiscall reflection::RPCCallBuilder::Finish(RPCCallBuilder *this)

{
  Offset<reflection::RPCCall> table;
  
  table.o = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(this->fbb_,this->start_);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::RPCCall>(this->fbb_,table,4);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::RPCCall>(this->fbb_,table,6);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::RPCCall>(this->fbb_,table,8);
  return (Offset<reflection::RPCCall>)table.o;
}

Assistant:

::flatbuffers::Offset<RPCCall> Finish() {
    const auto end = fbb_.EndTable(start_);
    auto o = ::flatbuffers::Offset<RPCCall>(end);
    fbb_.Required(o, RPCCall::VT_NAME);
    fbb_.Required(o, RPCCall::VT_REQUEST);
    fbb_.Required(o, RPCCall::VT_RESPONSE);
    return o;
  }